

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger base_assert(HSQUIRRELVM v)

{
  SQObjectType SVar1;
  bool bVar2;
  SQChar *in_RAX;
  SQObjectPtr *pSVar3;
  SQInteger SVar4;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  SQChar *str;
  SQChar *local_18;
  
  local_18 = in_RAX;
  pSVar3 = SQVM::GetAt(v,v->_stackbase + 1);
  bVar2 = SQVM::IsFalse(pSVar3);
  if (bVar2) {
    SVar4 = sq_gettop(v);
    if (2 < SVar4) {
      pSVar3 = SQVM::GetAt(v,v->_stackbase + 2);
      SVar1 = (pSVar3->super_SQObject)._type;
      if ((SVar1 == OT_NATIVECLOSURE) || (SVar1 == OT_CLOSURE)) {
        sq_pushroottable(v);
        uVar5 = sq_call(v,1,1,0);
        bVar6 = (byte)(uVar5 >> 0x3f);
        SVar4 = (long)~uVar5 >> 0x3f;
      }
      else {
        SVar4 = 3;
        bVar6 = 0;
      }
      bVar7 = 1;
      if ((bVar6 == 0) && (SVar4 = sq_tostring(v,SVar4), -1 < SVar4)) {
        local_18 = (SQChar *)0x0;
        SVar4 = sq_getstring(v,-1,&local_18);
        bVar7 = (byte)((ulong)SVar4 >> 0x3f);
        if (-1 < SVar4) {
          SVar4 = sq_throwerror(v,local_18);
        }
      }
      if (bVar7 == 0) {
        return SVar4;
      }
    }
    SVar4 = sq_throwerror(v,"assertion failed");
  }
  else {
    SVar4 = 0;
  }
  return SVar4;
}

Assistant:

static SQInteger base_assert(HSQUIRRELVM v)
{
    if(SQVM::IsFalse(stack_get(v,2))){
        if (sq_gettop(v) > 2) {
            SQObjectPtr &arg = stack_get(v,3);
            SQInteger msgIdx = 0;
            if (sq_type(arg)==OT_CLOSURE || sq_type(arg)==OT_NATIVECLOSURE) {
                sq_pushroottable(v);
                if (SQ_SUCCEEDED(sq_call(v, 1, SQTrue, SQFalse)))
                    msgIdx = -1;
            }
            else
                msgIdx = 3;

            if (msgIdx!=0 && SQ_SUCCEEDED(sq_tostring(v,msgIdx))) {
                const SQChar *str = 0;
                if (SQ_SUCCEEDED(sq_getstring(v,-1,&str)))
                    return sq_throwerror(v, str);
            }
        }

        return sq_throwerror(v, _SC("assertion failed"));
    }
    return 0;
}